

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

times * __thiscall lest::times::operator()(times *this,test *testing)

{
  _func_void_env_ptr *p_Var1;
  env *peVar2;
  ostream *poVar3;
  double dVar4;
  timer t;
  timer local_48;
  text local_40;
  
  local_48.start_ticks = current_ticks();
  p_Var1 = testing->behaviour;
  std::__cxx11::string::string((string *)&local_40,(string *)testing);
  peVar2 = env::operator()(&this->output,&local_40);
  (*p_Var1)(peVar2);
  std::__cxx11::string::~string((string *)&local_40);
  poVar3 = (this->super_action).os;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 5;
  dVar4 = timer::elapsed_seconds(&local_48);
  poVar3 = std::ostream::_M_insert<double>(dVar4 * 1000.0);
  poVar3 = std::operator<<(poVar3," ms: ");
  poVar3 = std::operator<<(poVar3,(string *)testing);
  std::operator<<(poVar3,"\n");
  return this;
}

Assistant:

times & operator()( test testing )
    {
        timer t;

        try
        {
            testing.behaviour( output( testing.name ) );
        }
        catch( message const & )
        {
            ++failures;
        }

        os << std::setw(5) << ( 1000 * t.elapsed_seconds() ) << " ms: " << testing.name  << "\n";

        return *this;
    }